

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O3

void __thiscall xe::ri::SampleList::SampleList(SampleList *this)

{
  (this->super_Item).m_type = TYPE_SAMPLELIST;
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__SampleList_001503b0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  (this->description)._M_string_length = 0;
  (this->description).field_2._M_local_buf[0] = '\0';
  (this->sampleInfo).super_Item.m_type = TYPE_SAMPLEINFO;
  (this->sampleInfo).super_Item._vptr_Item = (_func_int **)&PTR__SampleInfo_001503e8;
  List::List(&(this->sampleInfo).valueInfos);
  List::List(&this->samples);
  return;
}

Assistant:

SampleList		(void) : Item(TYPE_SAMPLELIST) {}